

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboCompletenessTests.cpp
# Opt level: O1

int __thiscall deqp::gles3::Functional::TestGroup::init(TestGroup *this,EVP_PKEY_CTX *ctx)

{
  Context *this_00;
  Context *pCVar1;
  TestGroup *pTVar2;
  int extraout_EAX;
  TestNode *pTVar3;
  ParamTest<deqp::gles3::Functional::NumLayersParams> *this_01;
  ParamTest<deqp::gles3::Functional::NumSamplesParams> *this_02;
  NumLayersParams *lp;
  NumLayersParams *pNVar4;
  NumSamplesParams *pNVar5;
  Params local_48;
  TestGroup *local_38;
  
  this_00 = &this->m_fboc;
  pTVar3 = &deqp::gls::fboc::details::Context::createRenderableTests(this_00)->super_TestNode;
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  pTVar3 = &deqp::gls::fboc::details::Context::createAttachmentTests(this_00)->super_TestNode;
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  pTVar3 = &deqp::gls::fboc::details::Context::createSizeTests(this_00)->super_TestNode;
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  pTVar3 = (TestNode *)operator_new(0x78);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  local_38 = this;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,pCVar1->m_testCtx,"layer","Tests for layer attachments");
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_02174168;
  pTVar3[1]._vptr_TestNode = (_func_int **)pCVar1;
  pNVar4 = init::s_layersParams;
  do {
    this_01 = (ParamTest<deqp::gles3::Functional::NumLayersParams> *)operator_new(0x88);
    local_48.textureKind = pNVar4->textureKind;
    local_48.numLayers = pNVar4->numLayers;
    local_48.attachmentLayer = pNVar4->attachmentLayer;
    deqp::gls::fboc::details::ParamTest<deqp::gles3::Functional::NumLayersParams>::ParamTest
              (this_01,this_00,&local_48);
    (this_01->super_TestBase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__TestCase_0218f8a0;
    tcu::TestNode::addChild(pTVar3,(TestNode *)this_01);
    pTVar2 = local_38;
    pNVar4 = pNVar4 + 1;
  } while (pNVar4 != (NumLayersParams *)init::s_samplesParams);
  tcu::TestNode::addChild((TestNode *)local_38,pTVar3);
  pTVar3 = (TestNode *)operator_new(0x78);
  pCVar1 = (pTVar2->super_TestCaseGroup).m_context;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,pCVar1->m_testCtx,"samples","Tests for multisample attachments"
            );
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_02174168;
  pTVar3[1]._vptr_TestNode = (_func_int **)pCVar1;
  pNVar5 = init::s_samplesParams;
  do {
    this_02 = (ParamTest<deqp::gles3::Functional::NumSamplesParams> *)operator_new(0x88);
    local_48.textureKind = pNVar5->numSamples[0];
    local_48.numLayers = pNVar5->numSamples[1];
    local_48.attachmentLayer = pNVar5->numSamples[2];
    deqp::gls::fboc::details::ParamTest<deqp::gles3::Functional::NumSamplesParams>::ParamTest
              (this_02,this_00,(Params *)&local_48);
    (this_02->super_TestBase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__TestCase_0218f8f8;
    tcu::TestNode::addChild(pTVar3,(TestNode *)this_02);
    pNVar5 = pNVar5 + 1;
  } while (pNVar5 != (NumSamplesParams *)"N4deqp5gles310Functional10ES3CheckerE");
  tcu::TestNode::addChild((TestNode *)local_38,pTVar3);
  return extraout_EAX;
}

Assistant:

void TestGroup::init (void)
{
	addChild(m_fboc.createRenderableTests());
	addChild(m_fboc.createAttachmentTests());
	addChild(m_fboc.createSizeTests());

	TestCaseGroup* layerTests = new TestCaseGroup(
		getContext(), "layer", "Tests for layer attachments");

	static const NumLayersParams s_layersParams[] =
		{ //  textureKind			numLayers	attachmentKind
			{ GL_TEXTURE_2D_ARRAY,	1,			0 },
			{ GL_TEXTURE_2D_ARRAY,	1,			3 },
			{ GL_TEXTURE_2D_ARRAY,	4,			3 },
			{ GL_TEXTURE_2D_ARRAY,	4,			15 },
			{ GL_TEXTURE_3D,		1,			0 },
			{ GL_TEXTURE_3D,		1,			15 },
			{ GL_TEXTURE_3D,		4,			15 },
			{ GL_TEXTURE_3D,		64,			15 },
		};

	for (const NumLayersParams* lp	=	DE_ARRAY_BEGIN(s_layersParams);
		 lp							!=  DE_ARRAY_END(s_layersParams);
		 ++lp)
		layerTests->addChild(new NumLayersTest(m_fboc, *lp));

	addChild(layerTests);

	TestCaseGroup* sampleTests = new TestCaseGroup(
		getContext(), "samples", "Tests for multisample attachments");

	static const NumSamplesParams s_samplesParams[] =
	{
		{ { 0,					SAMPLES_NONE,		SAMPLES_NONE } },
		{ { 1,					SAMPLES_NONE,		SAMPLES_NONE } },
		{ { 2,					SAMPLES_NONE,		SAMPLES_NONE } },
		{ { 0,					SAMPLES_TEXTURE,	SAMPLES_NONE } },
		{ { 1,					SAMPLES_TEXTURE,	SAMPLES_NONE } },
		{ { 2,					SAMPLES_TEXTURE,	SAMPLES_NONE } },
		{ { 2,					1,					SAMPLES_NONE } },
		{ { 2,					2,					SAMPLES_NONE } },
		{ { 0,					0,					SAMPLES_TEXTURE } },
		{ { 1,					2,					0 } },
		{ { 2,					2,					0 } },
		{ { 1,					1,					1 } },
		{ { 1,					2,					4 } },
	};

	for (const NumSamplesParams* lp	=	DE_ARRAY_BEGIN(s_samplesParams);
		 lp							!=  DE_ARRAY_END(s_samplesParams);
		 ++lp)
		sampleTests->addChild(new NumSamplesTest(m_fboc, *lp));

	addChild(sampleTests);
}